

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# termcolor.hpp
# Opt level: O2

ostream * termcolor::cyan(ostream *stream)

{
  bool bVar1;
  
  bVar1 = _internal::is_colorized(stream);
  if (bVar1) {
    std::operator<<(stream,"\x1b[36m");
  }
  return stream;
}

Assistant:

inline
    std::ostream& cyan(std::ostream& stream)
    {
        if (_internal::is_colorized(stream))
        {
        #if defined(TERMCOLOR_OS_MACOS) || defined(TERMCOLOR_OS_LINUX)
            stream << "\033[36m";
        #elif defined(TERMCOLOR_OS_WINDOWS)
            _internal::win_change_attributes(stream,
                FOREGROUND_BLUE | FOREGROUND_GREEN
            );
        #endif
        }
        return stream;
    }